

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcUtil.cpp
# Opt level: O0

double XmlRpc::XmlRpcUtil::log(double __x)

{
  char in_AL;
  int iVar1;
  XmlRpcLogHandler *pXVar2;
  char *in_RSI;
  int in_EDI;
  double extraout_XMM0_Qa;
  double dVar3;
  char buf [1024];
  va_list va;
  undefined1 local_4d8 [48];
  double local_4a8;
  char local_428 [1023];
  undefined1 local_29;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_10;
  int local_4;
  
  if (in_AL != '\0') {
    local_4a8 = __x;
  }
  local_10 = in_RSI;
  local_4 = in_EDI;
  iVar1 = XmlRpcLogHandler::getVerbosity();
  dVar3 = extraout_XMM0_Qa;
  if (in_EDI <= iVar1) {
    local_18 = local_4d8;
    local_20 = &stack0x00000008;
    local_24 = 0x30;
    local_28 = 0x10;
    vsnprintf(local_428,0x3ff,local_10,&local_28);
    local_29 = 0;
    pXVar2 = XmlRpcLogHandler::getLogHandler();
    dVar3 = (double)(**(code **)(*(long *)pXVar2 + 0x10))(pXVar2,local_4,local_428);
  }
  return dVar3;
}

Assistant:

void XmlRpcUtil::log(int level, const char* fmt, ...)
{
  if (level <= XmlRpcLogHandler::getVerbosity())
  {
    va_list va;
    char buf[1024];
    va_start( va, fmt);
    std::vsnprintf(buf,sizeof(buf)-1,fmt,va);
    va_end(va);
    buf[sizeof(buf)-1] = 0;
    XmlRpcLogHandler::getLogHandler()->log(level, buf);
  }
}